

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CGameConsole::OnConsoleInit(CGameConsole *this)

{
  int iVar1;
  IConsole *pIVar2;
  CConfig *pCVar3;
  CGameConsole *in_RDI;
  IKernel *in_stack_ffffffffffffffe0;
  
  CInstance::Init(&in_RDI->m_LocalConsole,in_RDI);
  CInstance::Init(&in_RDI->m_RemoteConsole,in_RDI);
  CComponent::Kernel((CComponent *)0x158631);
  pIVar2 = IKernel::RequestInterface<IConsole>(in_stack_ffffffffffffffe0);
  in_RDI->m_pConsole = pIVar2;
  pIVar2 = CComponent::Console((CComponent *)0x158647);
  pCVar3 = CComponent::Config((CComponent *)0x158656);
  iVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x17])
                    (pIVar2,(ulong)(uint)pCVar3->m_ConsoleOutputLevel,ClientConsolePrintCallback,
                     in_RDI);
  in_RDI->m_PrintCBIndex = iVar1;
  pIVar2 = CComponent::Console((CComponent *)0x158686);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"toggle_local_console","",2,ConToggleLocalConsole,in_RDI,"Toggle local console")
  ;
  pIVar2 = CComponent::Console((CComponent *)0x1586c3);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"toggle_remote_console","",2,ConToggleRemoteConsole,in_RDI,
             "Toggle remote console");
  pIVar2 = CComponent::Console((CComponent *)0x158700);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"clear_local_console","",2,ConClearLocalConsole,in_RDI,"Clear local console");
  pIVar2 = CComponent::Console((CComponent *)0x15873d);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"clear_remote_console","",2,ConClearRemoteConsole,in_RDI,"Clear remote console")
  ;
  pIVar2 = CComponent::Console((CComponent *)0x15877a);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"dump_local_console","",2,ConDumpLocalConsole,in_RDI,
             "Write local console contents to a text file");
  pIVar2 = CComponent::Console((CComponent *)0x1587b7);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"dump_remote_console","",2,ConDumpRemoteConsole,in_RDI,
             "Write remote console contents to a text file");
  pIVar2 = CComponent::Console((CComponent *)0x1587f4);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0xf])
            (pIVar2,"console_output_level",ConchainConsoleOutputLevelUpdate,in_RDI);
  return;
}

Assistant:

void CGameConsole::OnConsoleInit()
{
	// init console instances
	m_LocalConsole.Init(this);
	m_RemoteConsole.Init(this);

	m_pConsole = Kernel()->RequestInterface<IConsole>();

	m_PrintCBIndex = Console()->RegisterPrintCallback(Config()->m_ConsoleOutputLevel, ClientConsolePrintCallback, this);

	Console()->Register("toggle_local_console", "", CFGFLAG_CLIENT, ConToggleLocalConsole, this, "Toggle local console");
	Console()->Register("toggle_remote_console", "", CFGFLAG_CLIENT, ConToggleRemoteConsole, this, "Toggle remote console");
	Console()->Register("clear_local_console", "", CFGFLAG_CLIENT, ConClearLocalConsole, this, "Clear local console");
	Console()->Register("clear_remote_console", "", CFGFLAG_CLIENT, ConClearRemoteConsole, this, "Clear remote console");
	Console()->Register("dump_local_console", "", CFGFLAG_CLIENT, ConDumpLocalConsole, this, "Write local console contents to a text file");
	Console()->Register("dump_remote_console", "", CFGFLAG_CLIENT, ConDumpRemoteConsole, this, "Write remote console contents to a text file");

#ifdef CONF_DEBUG
	Console()->Register("dump_commands", "", CFGFLAG_CLIENT, ConDumpCommands, this, "Write list of all commands to a text file");
#endif

	Console()->Chain("console_output_level", ConchainConsoleOutputLevelUpdate, this);
}